

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::Strucmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_18;
  char *s2_local;
  char *s1_local;
  
  local_18 = s2;
  s2_local = s1;
  while( true ) {
    bVar3 = false;
    if (*s2_local != '\0') {
      iVar1 = tolower((int)*s2_local);
      iVar2 = tolower((int)*local_18);
      bVar3 = iVar1 == iVar2;
    }
    if (!bVar3) break;
    s2_local = s2_local + 1;
    local_18 = local_18 + 1;
  }
  iVar1 = tolower((int)*s2_local);
  iVar2 = tolower((int)*local_18);
  return iVar1 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char *s1, const char *s2)
{
  // lifted from Graphvis http://www.graphviz.org
  while ((*s1 != '\0')
         && (tolower(*s1) == tolower(*s2)))
    {
      s1++;
      s2++;
    }

  return tolower(*s1) - tolower(*s2);
}